

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O3

void __thiscall icu_63::RuleBasedCollator::RuleBasedCollator(RuleBasedCollator *this)

{
  Collator::Collator(&this->super_Collator);
  (this->super_Collator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedCollator_003ee2d0;
  this->data = (CollationData *)0x0;
  this->settings = (CollationSettings *)0x0;
  this->tailoring = (CollationTailoring *)0x0;
  this->cacheEntry = (CollationCacheEntry *)0x0;
  Locale::Locale(&this->validLocale,"",(char *)0x0,(char *)0x0,(char *)0x0);
  this->explicitlySetAttributes = 0;
  this->actualLocaleIsSameAsValid = '\0';
  return;
}

Assistant:

RuleBasedCollator::RuleBasedCollator()
        : data(NULL),
          settings(NULL),
          tailoring(NULL),
          cacheEntry(NULL),
          validLocale(""),
          explicitlySetAttributes(0),
          actualLocaleIsSameAsValid(FALSE) {
}